

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.h
# Opt level: O0

void __thiscall OpenCLEnum::Device::~Device(Device *this)

{
  Device *this_local;
  
  std::__cxx11::string::~string((string *)&this->version);
  std::__cxx11::string::~string((string *)&this->vendor);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Device()
		{
			device_type			= 0;
			compute_units		= 0;
			mem_size			= 0;
			clock				= 0;
			nvidia_pci_bus_id	= 0;
			nvidia_pci_slot_id	= 0;
			has_cl_khr_spir		= false;
		}